

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFlushFinishTests.cpp
# Opt level: O1

vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *
deqp::gles3::Functional::anon_unknown_0::getPointsFromSamples
          (vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
           *__return_storage_ptr__,
          vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
          *samples,offset_in_Sample_to_unknown field)

{
  ulong uVar1;
  pointer pVVar2;
  long lVar3;
  pointer pSVar4;
  ulong uVar5;
  allocator_type local_19;
  
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            (__return_storage_ptr__,
             (long)(samples->
                   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,&local_19);
  pSVar4 = (samples->
           super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((samples->
      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
      )._M_impl.super__Vector_impl_data._M_finish != pSVar4) {
    lVar3 = 0;
    uVar5 = 0;
    do {
      uVar1 = *(ulong *)((long)&pSVar4->numDrawCalls + field + lVar3);
      pVVar2 = (__return_storage_ptr__->
               super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[uVar5].m_data[0] = (float)*(int *)((long)&pSVar4->numDrawCalls + lVar3);
      pVVar2[uVar5].m_data[1] = (float)uVar1;
      uVar5 = uVar5 + 1;
      pSVar4 = (samples->
               super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x20;
    } while (uVar5 < (ulong)((long)(samples->
                                   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar4 >> 5))
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vec2> getPointsFromSamples (const std::vector<FlushFinishCase::Sample>& samples, const deUint64 FlushFinishCase::Sample::*field)
{
	vector<Vec2> points(samples.size());

	for (size_t ndx = 0; ndx < samples.size(); ndx++)
		points[ndx] = Vec2(float(samples[ndx].numDrawCalls), float(samples[ndx].*field));

	return points;
}